

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_diag.cc
# Opt level: O1

void __thiscall
ipx::KKTSolverDiag::_Solve
          (KKTSolverDiag *this,Vector *a,Vector *b,double tol,Vector *x,Vector *y,Info *info)

{
  NormalMatrix *this_00;
  DiagonalPrecond *this_01;
  ipxint *piVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Model *pMVar7;
  double *pdVar8;
  double *pdVar9;
  pointer piVar10;
  pointer piVar11;
  pointer pdVar12;
  double *pdVar13;
  double *pdVar14;
  Info *pIVar15;
  Int IVar16;
  size_t sVar17;
  NormalMatrix *__timer;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar24;
  Vector rhs;
  ConjugateResiduals cr;
  Vector local_70;
  Vector *local_60;
  double local_58;
  Info *local_50;
  ConjugateResiduals local_48;
  
  pMVar7 = this->model_;
  uVar3 = pMVar7->num_rows_;
  iVar4 = pMVar7->num_cols_;
  lVar22 = (long)iVar4;
  local_70._M_size = b->_M_size;
  local_58 = tol;
  local_70._M_data = (double *)operator_new(local_70._M_size << 3);
  if (local_70._M_size != 0) {
    pdVar8 = b->_M_data;
    sVar17 = 0;
    do {
      local_70._M_data[sVar17] = -pdVar8[sVar17];
      sVar17 = sVar17 + 1;
    } while (local_70._M_size != sVar17);
  }
  uVar18 = uVar3 + iVar4;
  if (uVar18 != 0 && SCARRY4(uVar3,iVar4) == (int)uVar18 < 0) {
    pdVar8 = (this->W_)._M_data;
    pdVar9 = a->_M_data;
    piVar10 = (pMVar7->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = 0;
    do {
      iVar5 = piVar10[uVar19];
      lVar20 = (long)iVar5;
      iVar6 = piVar10[uVar19 + 1];
      if (iVar5 < iVar6) {
        dVar24 = pdVar8[uVar19];
        dVar2 = pdVar9[uVar19];
        piVar11 = (pMVar7->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar12 = (pMVar7->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar5 = piVar11[lVar20];
          local_70._M_data[iVar5] = pdVar12[lVar20] * dVar24 * dVar2 + local_70._M_data[iVar5];
          lVar20 = lVar20 + 1;
        } while (iVar6 != lVar20);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar18);
  }
  local_60 = b;
  local_50 = info;
  if (y->_M_size != 0) {
    memset(y->_M_data,0,y->_M_size << 3);
  }
  this_00 = &this->normal_matrix_;
  NormalMatrix::reset_time(this_00);
  this_01 = &this->precond_;
  DiagonalPrecond::reset_time(this_01);
  ConjugateResiduals::ConjugateResiduals(&local_48,this->control_);
  pIVar15 = local_50;
  __timer = this_00;
  ConjugateResiduals::Solve
            (&local_48,&this_00->super_LinearOperator,&this_01->super_LinearOperator,&local_70,
             local_58,(this->resscale_)._M_data,this->maxiter_,y);
  IVar16 = ConjugateResiduals::errflag(&local_48);
  (pIVar15->super_ipx_info).errflag = IVar16;
  IVar16 = ConjugateResiduals::iter(&local_48);
  piVar1 = &(pIVar15->super_ipx_info).kktiter1;
  *piVar1 = *piVar1 + IVar16;
  ConjugateResiduals::time(&local_48,(time_t *)__timer);
  (pIVar15->super_ipx_info).time_cr1 = extraout_XMM0_Qa + (pIVar15->super_ipx_info).time_cr1;
  NormalMatrix::time(this_00,(time_t *)__timer);
  (pIVar15->super_ipx_info).time_cr1_AAt =
       extraout_XMM0_Qa_00 + (pIVar15->super_ipx_info).time_cr1_AAt;
  DiagonalPrecond::time(this_01,(time_t *)__timer);
  (pIVar15->super_ipx_info).time_cr1_pre =
       extraout_XMM0_Qa_01 + (pIVar15->super_ipx_info).time_cr1_pre;
  IVar16 = ConjugateResiduals::iter(&local_48);
  this->iter_ = this->iter_ + IVar16;
  if (0 < (int)uVar3) {
    pdVar8 = local_60->_M_data;
    pdVar9 = x->_M_data;
    uVar19 = 0;
    do {
      pdVar9[lVar22 + uVar19] = pdVar8[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar3 != uVar19);
  }
  if (0 < iVar4) {
    piVar10 = (pMVar7->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar8 = y->_M_data;
    pdVar9 = (this->W_)._M_data;
    pdVar13 = a->_M_data;
    pdVar14 = x->_M_data;
    lVar20 = 0;
    do {
      iVar4 = piVar10[lVar20];
      lVar21 = (long)iVar4;
      iVar5 = piVar10[lVar20 + 1];
      dVar24 = 0.0;
      if (iVar4 < iVar5) {
        lVar23 = lVar21;
        do {
          dVar24 = dVar24 + pdVar8[(pMVar7->AI_).rowidx_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar23]] *
                            (pMVar7->AI_).values_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar23];
          lVar23 = lVar23 + 1;
        } while (iVar5 != lVar23);
      }
      pdVar14[lVar20] = (pdVar13[lVar20] - dVar24) * pdVar9[lVar20];
      if (iVar4 < iVar5) {
        piVar11 = (pMVar7->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar12 = (pMVar7->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          lVar23 = piVar11[lVar21] + lVar22;
          pdVar14[lVar23] = pdVar14[lVar23] - pdVar14[lVar20] * pdVar12[lVar21];
          lVar21 = lVar21 + 1;
        } while (iVar5 != lVar21);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar22);
  }
  operator_delete(local_70._M_data);
  return;
}

Assistant:

void KKTSolverDiag::_Solve(const Vector& a, const Vector& b, double tol,
                            Vector& x, Vector& y, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    assert(factorized_);

    // Compose right-hand side AI*W*a-b.
    Vector rhs = -b;
    for (Int j = 0; j < n+m; j++)
        ScatterColumn(AI, j, W_[j]*a[j], rhs);

    // Solve normal equations.
    y = 0.0;
    normal_matrix_.reset_time();
    precond_.reset_time();
    ConjugateResiduals cr(control_);
    cr.Solve(normal_matrix_, precond_, rhs, tol, &resscale_[0], maxiter_, y);
    info->errflag = cr.errflag();
    info->kktiter1 += cr.iter();
    info->time_cr1 += cr.time();
    info->time_cr1_AAt += normal_matrix_.time();
    info->time_cr1_pre += precond_.time();
    iter_ += cr.iter();

    // Recover solution to KKT system.
    for (Int i = 0; i < m; i++)
        x[n+i] = b[i];
    for (Int j = 0; j < n; j++) {
        double aty = DotColumn(AI, j, y);
        x[j] = W_[j] * (a[j]-aty);
        for (Int p = AI.begin(j); p < AI.end(j); p++) {
            Int i = AI.index(p);
            x[n+i] -= x[j] * AI.value(p);
        }
    }
}